

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

ByteData256 *
cfd::CreateTxSighash
          (TransactionContext *transaction,OutPoint *outpoint,UtxoData *utxo,
          SigHashType *sighash_type,Pubkey *pubkey,Script *redeem_script,WitnessVersion version,
          ByteData *annex,TaprootScriptTree *script_tree)

{
  byte bVar1;
  long in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  ByteData256 *in_RDI;
  SigHashType *in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  int in_stack_00000010;
  long in_stack_00000020;
  ByteData256 tapleaf_hash;
  ByteData sig;
  uint32_t *in_stack_00000568;
  ByteData256 *in_stack_00000570;
  SigHashType *in_stack_00000578;
  OutPoint *in_stack_00000580;
  TransactionContext *in_stack_00000588;
  ByteData *in_stack_000005a0;
  ByteData256 *in_stack_fffffffffffffea8;
  undefined4 uVar3;
  ByteData *pBVar2;
  ByteData256 *in_stack_fffffffffffffeb0;
  SigHashType local_dc [12];
  undefined1 local_d0 [28];
  SigHashType local_b4 [12];
  undefined1 local_a8 [28];
  undefined4 local_8c;
  ByteData256 local_60;
  ByteData local_48;
  undefined8 local_30;
  SigHashType *local_28;
  long local_20;
  undefined8 local_18;
  long *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  cfd::core::ByteData::ByteData(&local_48);
  if (in_stack_00000010 == 1) {
    cfd::core::ByteData256::ByteData256(&local_60);
    if (in_stack_00000020 != 0) {
      cfd::core::TaprootScriptTree::GetTapLeafHash();
      core::ByteData256::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      core::ByteData256::~ByteData256((ByteData256 *)0x3b0771);
    }
    TransactionContext::CreateSignatureHashByTaproot
              (in_stack_00000588,in_stack_00000580,in_stack_00000578,in_stack_00000570,
               in_stack_00000568,in_stack_000005a0);
    local_8c = 1;
    core::ByteData256::~ByteData256((ByteData256 *)0x3b0847);
  }
  else {
    bVar1 = cfd::core::Script::IsEmpty();
    uVar3 = (undefined4)((ulong)in_stack_fffffffffffffea8 >> 0x20);
    if ((bVar1 & 1) == 0) {
      cfd::core::SigHashType::SigHashType(local_dc,local_28);
      pBVar2 = (ByteData *)CONCAT44(uVar3,in_stack_00000010);
      (**(code **)(*local_10 + 0xa0))
                (local_d0,local_10,local_18,in_stack_00000008,local_dc,local_20 + 600);
      core::ByteData::operator=((ByteData *)in_stack_fffffffffffffeb0,pBVar2);
      core::ByteData::~ByteData((ByteData *)0x3b09bf);
    }
    else {
      cfd::core::SigHashType::SigHashType(local_b4,local_28);
      pBVar2 = (ByteData *)CONCAT44(uVar3,in_stack_00000010);
      (**(code **)(*local_10 + 0x98))(local_a8,local_10,local_18,local_30,local_b4,local_20 + 600);
      core::ByteData::operator=((ByteData *)in_stack_fffffffffffffeb0,pBVar2);
      core::ByteData::~ByteData((ByteData *)0x3b0916);
    }
    cfd::core::ByteData256::ByteData256(in_RDI,&local_48);
    local_8c = 1;
  }
  core::ByteData::~ByteData((ByteData *)0x3b09ed);
  return in_RDI;
}

Assistant:

static ByteData256 CreateTxSighash(
    const TransactionContext* transaction, const OutPoint& outpoint,
    const UtxoData& utxo, const SigHashType& sighash_type,
    const Pubkey& pubkey, const Script& redeem_script, WitnessVersion version,
    const ByteData* annex, const TaprootScriptTree* script_tree) {
  ByteData sig;
  if (version == WitnessVersion::kVersion1) {
    ByteData256 tapleaf_hash;
    if (script_tree != nullptr) tapleaf_hash = script_tree->GetTapLeafHash();
    return transaction->CreateSignatureHashByTaproot(
        outpoint, sighash_type,
        (script_tree != nullptr) ? &tapleaf_hash : nullptr, 0, annex);
  } else if (redeem_script.IsEmpty()) {
    sig = transaction->CreateSignatureHash(
        outpoint, pubkey, sighash_type, utxo.amount, version);
  } else {
    sig = transaction->CreateSignatureHash(
        outpoint, redeem_script, sighash_type, utxo.amount, version);
  }
  return ByteData256(sig);
}